

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

void apx_client_attach_connection(apx_client_t *self,apx_clientConnection_t *connection)

{
  int32_t iVar1;
  adt_ary_t *array;
  apx_nodeInstance_t *node_instance;
  int s32Index;
  
  if (connection != (apx_clientConnection_t *)0x0 && self != (apx_client_t *)0x0) {
    self->connection = connection;
    apx_clientConnection_set_client(connection,self);
    apx_clientConnection_attach_node_manager(connection,self->node_manager);
    if (self->connection != (apx_clientConnection_t *)0x0) {
      array = adt_ary_new((_func_void_void_ptr *)0x0);
      if (array != (adt_ary_t *)0x0) {
        iVar1 = apx_nodeManager_values(self->node_manager,array);
        if (0 < iVar1) {
          s32Index = 0;
          do {
            node_instance = (apx_nodeInstance_t *)adt_ary_value(array,s32Index);
            apx_clientConnection_attach_node_instance(self->connection,node_instance);
            s32Index = s32Index + 1;
          } while (iVar1 != s32Index);
        }
        adt_ary_delete(array);
        return;
      }
    }
  }
  return;
}

Assistant:

void apx_client_attach_connection(apx_client_t *self, apx_clientConnection_t *connection)
{
   if ( (self != NULL) && (connection != 0) )
   {
      self->connection = connection;
      apx_clientConnection_set_client(connection, self);
      apx_clientConnection_attach_node_manager(connection, self->node_manager);
      apx_client_attach_local_nodes_to_connection(self); //TODO: This should not be necessary as an explicit step.
                                                         // Merge functionality with call to to apx_clientConnection_attach_node_manager
   }
}